

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O0

bool __thiscall llvm::StringRef::consume_front(StringRef *this,StringRef Prefix)

{
  bool bVar1;
  size_t N;
  StringRef SVar2;
  char *local_48;
  size_t local_40;
  StringRef *this_local;
  StringRef Prefix_local;
  
  Prefix_local.Data = (char *)Prefix.Length;
  this_local = (StringRef *)Prefix.Data;
  bVar1 = startswith(this,Prefix);
  if (bVar1) {
    N = size((StringRef *)&this_local);
    SVar2 = drop_front(this,N);
    local_48 = SVar2.Data;
    this->Data = local_48;
    local_40 = SVar2.Length;
    this->Length = local_40;
  }
  return bVar1;
}

Assistant:

bool consume_front(StringRef Prefix) {
      if (!startswith(Prefix))
        return false;

      *this = drop_front(Prefix.size());
      return true;
    }